

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopFont(void)

{
  int iVar1;
  ImFontAtlas *pIVar2;
  ImGuiContext *pIVar3;
  ImFont **ppIVar4;
  uint uVar5;
  ImFont *font;
  
  pIVar3 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  iVar1 = (pIVar3->FontStack).Size;
  if (iVar1 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                  ,0x4ed,"void ImVector<ImFont *>::pop_back() [T = ImFont *]");
  }
  uVar5 = iVar1 - 1;
  (pIVar3->FontStack).Size = uVar5;
  if (uVar5 == 0) {
    font = (GImGui->IO).FontDefault;
    if (font != (ImFont *)0x0) goto LAB_00147ab0;
    pIVar2 = (GImGui->IO).Fonts;
    if ((pIVar2->Fonts).Size < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                    ,0x4d8,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
    }
    ppIVar4 = (pIVar2->Fonts).Data;
  }
  else {
    if (iVar1 == 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                    ,0x4e2,"T &ImVector<ImFont *>::back() [T = ImFont *]");
    }
    ppIVar4 = (pIVar3->FontStack).Data + ((ulong)uVar5 - 1);
  }
  font = *ppIVar4;
LAB_00147ab0:
  SetCurrentFont(font);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}